

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O1

void __thiscall Security::EncodeLargeConstants(Security *this)

{
  Instr *pIVar1;
  Opnd *this_00;
  Opnd *opnd;
  Opnd *opnd_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  Type *ppBVar7;
  uint uVar8;
  Instr *this_03;
  LabelInstr *label;
  
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar4 = JITTimeFunctionBody::GetSourceContextId(this_01);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,EncodeConstantsPhase,uVar4,uVar5);
  if (((!bVar2) &&
      (bVar2 = Js::ConfigFlagsTable::IsEnabled
                         ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag), !bVar2)) &&
     (this_03 = this->func->m_headInstr, this_03 != (Instr *)0x0)) {
    do {
      pIVar1 = this_03->m_next;
      bVar2 = IR::Instr::IsRealInstr(this_03);
      if (bVar2) {
        this_00 = this_03->m_dst;
        opnd = this_03->m_src1;
        opnd_00 = this_03->m_src2;
        uVar4 = 0;
        if (this_00 != (Opnd *)0x0) {
          if ((this->baseOpnd != (RegOpnd *)0x0) &&
             (bVar2 = IR::Opnd::IsEqual(this_00,&this->baseOpnd->super_Opnd), bVar2)) {
            if (this->cookieOpnd != (IntConstOpnd *)0x0) {
              IR::Opnd::Free(&this->cookieOpnd->super_Opnd,this->func);
            }
            this->basePlusCookieOpnd = (RegOpnd *)0x0;
            this->cookieOpnd = (IntConstOpnd *)0x0;
            this->baseOpnd = (RegOpnd *)0x0;
          }
          uVar4 = CalculateConstSize(this_00);
        }
        uVar5 = 0;
        if (opnd == (Opnd *)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = CalculateConstSize(opnd);
          if (opnd_00 == (Opnd *)0x0) {
            uVar5 = 0;
          }
          else {
            uVar5 = CalculateConstSize(opnd_00);
          }
        }
        uVar8 = uVar6 + uVar4 + uVar5;
        if ((2 < uVar8) ||
           (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,EncodeConstantsPhase), bVar2)) {
          if (uVar4 < 2) {
            bVar2 = false;
          }
          else {
            if ((uVar4 == uVar6 && opnd != (Opnd *)0x0) &&
               (bVar2 = IR::Opnd::IsEqual(opnd,this_00), bVar2)) {
              uVar8 = uVar8 - uVar4;
              bVar2 = true;
              if ((uVar8 < 3) &&
                 (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,EncodeConstantsPhase),
                 bVar2 = true, !bVar3)) goto LAB_0062b050;
            }
            else {
              bVar2 = false;
            }
            EncodeOpnd(this,this_03,this_00);
            if (bVar2) {
              IR::Instr::ReplaceSrc1(this_03,this_00);
            }
            uVar8 = uVar8 - uVar4;
            if ((uVar8 < 3) &&
               (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,EncodeConstantsPhase), !bVar3)
               ) goto LAB_0062b050;
          }
          if ((uVar6 < 2) || ((bVar2 || (EncodeOpnd(this,this_03,opnd), 2 < uVar8 - uVar6)))) {
            if (1 < uVar5) goto LAB_0062b040;
          }
          else {
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,EncodeConstantsPhase);
            if ((1 < uVar5) && (bVar2)) {
LAB_0062b040:
              EncodeOpnd(this,this_03,opnd_00);
            }
          }
        }
      }
      else if ((this_03->m_kind == InstrKindProfiledLabel) || (this_03->m_kind == InstrKindLabel)) {
        if ((1 < *(uint *)&this_03[1].m_noLazyHelperAssert) ||
           ((*(uint *)&this_03[1].m_noLazyHelperAssert == 1 &&
            (ppBVar7 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                                 ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *
                                  )(this_03 + 1)), *ppBVar7 != (Type)this_03->m_prev)))) {
          if (this->cookieOpnd != (IntConstOpnd *)0x0) {
            IR::Opnd::Free(&this->cookieOpnd->super_Opnd,this->func);
          }
          this->basePlusCookieOpnd = (RegOpnd *)0x0;
          this->cookieOpnd = (IntConstOpnd *)0x0;
          this->baseOpnd = (RegOpnd *)0x0;
        }
      }
LAB_0062b050:
      this_03 = pIVar1;
    } while (pIVar1 != (Instr *)0x0);
  }
  return;
}

Assistant:

void
Security::EncodeLargeConstants()
{
#pragma prefast(suppress:6236 6285, "logical-or of constants is by design")
    if (PHASE_OFF(Js::EncodeConstantsPhase, this->func) || CONFIG_ISENABLED(Js::DebugFlag) || !MD_ENCODE_LG_CONSTS)
    {
        return;
    }

    uint prevInstrConstSize = 0;
    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        if (!instr->IsRealInstr())
        {
            if (instr->IsLabelInstr())
            {
                IR::LabelInstr * label = instr->AsLabelInstr();

                if (label->labelRefs.Count() > 1 || (label->labelRefs.Count() == 1 && label->labelRefs.Head() != label->m_prev))
                {
                    if (this->cookieOpnd != nullptr)
                    {
                        this->cookieOpnd->Free(this->func);
                    }
                    this->baseOpnd = nullptr;
                    this->cookieOpnd = nullptr;
                    this->basePlusCookieOpnd = nullptr;
                }
            }
            continue;
        }

        IR::Opnd *src1 = instr->GetSrc1();
        IR::Opnd *src2 = instr->GetSrc2();
        IR::Opnd *dst = instr->GetDst();

        if (dst && this->baseOpnd && dst->IsEqual(this->baseOpnd))
        {
            if (this->cookieOpnd != nullptr)
            {
                this->cookieOpnd->Free(this->func);
            }
            this->baseOpnd = nullptr;
            this->cookieOpnd = nullptr;
            this->basePlusCookieOpnd = nullptr;
        }

        uint currInstrConstSize = 0;
        uint dstSize = dst ? CalculateConstSize(dst) : 0;
        uint src1Size = 0;
        uint src2Size = 0;
        if (src1)
        {
            src1Size = CalculateConstSize(src1);
            if (src2)
            {
                src2Size = CalculateConstSize(src2);
            }
        }

        prevInstrConstSize = currInstrConstSize;
        currInstrConstSize = dstSize + src1Size + src2Size;

        // we don't need to blind constants if user controlled byte size < 3
        if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
        {
            continue;
        }

        bool isSrc1EqualDst = false;
        if (dstSize >= 2)
        {
            // don't count instrs where dst == src1 against size
            if (src1 && dstSize == src1Size && src1->IsEqual(dst))
            {
                currInstrConstSize -= dstSize;
                isSrc1EqualDst = true;

                if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
                {
                    continue;
                }
            }

            this->EncodeOpnd(instr, dst);
            if (isSrc1EqualDst)
            {
                instr->ReplaceSrc1(dst);
            }
            currInstrConstSize -= dstSize;
            if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
            {
                continue;
            }
        }
        if (src1Size >= 2 && !isSrc1EqualDst)
        {
            this->EncodeOpnd(instr, src1);
            currInstrConstSize -= src1Size;
            if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
            {
                continue;
            }
        }
        if (src2Size >= 2)
        {
            this->EncodeOpnd(instr, src2);
            currInstrConstSize -= src2Size;
        }
    } NEXT_INSTR_IN_FUNC_EDITING;

}